

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_init_var_test(btree_kv_ops *kv_ops)

{
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var1;
  btree *pbVar2;
  btree *pbVar3;
  void *pvVar4;
  btree *pbVar5;
  void *pvStack_c0;
  btree local_b8;
  byte local_7a;
  byte local_79;
  uint8_t vsize;
  btree *pbStack_78;
  uint8_t ksize;
  btree *tree;
  void *value;
  void *key;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  pvStack_c0 = (void *)0x1015ec;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  pvStack_c0 = (void *)0x101601;
  memleak_start();
  pbStack_78 = &local_b8;
  local_79 = 8;
  local_7a = 8;
  value = (void *)0x0;
  tree = (btree *)0x0;
  pvStack_c0 = (void *)0x10163a;
  (*kv_ops->init_kv_var)(pbStack_78,(void *)0x0,(void *)0x0);
  if (value != (void *)0x0) {
    pvStack_c0 = (void *)0x101665;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x4c);
    kv_init_var_test::__test_pass = 0;
    if (value != (void *)0x0) {
      pvStack_c0 = (void *)0x101697;
      __assert_fail("key == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x4c,"void kv_init_var_test(btree_kv_ops *)");
    }
  }
  if (tree != (btree *)0x0) {
    pvStack_c0 = (void *)0x1016c4;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x4d);
    kv_init_var_test::__test_pass = 0;
    if (tree != (btree *)0x0) {
      pvStack_c0 = (void *)0x1016f6;
      __assert_fail("value == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x4d,"void kv_init_var_test(btree_kv_ops *)");
    }
  }
  value = (void *)((long)&local_b8 - (ulong)(local_79 + 0xf & 0xfffffff0));
  pbVar5 = (btree *)((long)value - (ulong)(local_7a + 0xf & 0xfffffff0));
  tree = pbVar5;
  pbStack_78->ksize = local_79;
  pbStack_78->vsize = local_7a;
  pvVar4 = value;
  pbVar3 = tree;
  pbVar2 = pbStack_78;
  p_Var1 = kv_ops->init_kv_var;
  pbVar5[-1].aux = (void *)0x101753;
  (*p_Var1)(pbVar2,pvVar4,pbVar3);
  if (*value != '\0') {
    pbVar5[-1].aux = (void *)0x101783;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x55);
    kv_init_var_test::__test_pass = 0;
    if (*value != '\0') {
      pbVar5[-1].aux = (void *)0x1017ba;
      __assert_fail("*(uint8_t *)key == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x55,"void kv_init_var_test(btree_kv_ops *)");
    }
  }
  if (tree->ksize != '\0') {
    pbVar5[-1].aux = (void *)0x1017ec;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x56);
    kv_init_var_test::__test_pass = 0;
    if (tree->ksize != '\0') {
      pbVar5[-1].aux = (void *)0x101823;
      __assert_fail("*(uint8_t *)value == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x56,"void kv_init_var_test(btree_kv_ops *)");
    }
  }
  pbVar5[-1].aux = (void *)0x10182a;
  memleak_end();
  if (kv_init_var_test::__test_pass == 0) {
    pbVar5[-1].aux = (void *)0x101873;
    fprintf(_stderr,"%s FAILED\n","kv init var test");
  }
  else {
    pbVar5[-1].aux = (void *)0x101852;
    fprintf(_stderr,"%s PASSED\n","kv init var test");
  }
  return;
}

Assistant:

void kv_init_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();
    void *key, *value;
    btree *tree = alca(struct btree, 1);
    uint8_t ksize = 8;
    uint8_t vsize = 8;

    // unintialized key/value
    key = NULL;
    value = NULL;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK(key == NULL);
    TEST_CHK(value == NULL);

    // initialized
    key = (void *)alca(uint8_t, ksize);
    value = (void *)alca(uint8_t, vsize);
    tree->ksize = ksize;
    tree->vsize = vsize;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK( *(uint8_t *)key == 0 );
    TEST_CHK( *(uint8_t *)value == 0 );

    memleak_end();
    TEST_RESULT("kv init var test");
}